

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O3

void __thiscall
TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_>::ComputeV2
          (TPZDohrPrecond<long_double,_TPZDohrSubstruct<long_double>_> *this,
          TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *v2)

{
  int isub;
  _List_node_base *p_Var1;
  TPZFNMatrix<100,_long_double> v2_local;
  TPZFNMatrix<100,_long_double> Residual_local;
  TPZFMatrix<long_double> local_df8;
  longdouble alStack_d68 [101];
  TPZFMatrix<long_double> local_718;
  longdouble local_688 [101];
  
  p_Var1 = (this->fGlobal).
           super__List_base<TPZAutoPointer<TPZDohrSubstruct<long_double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<long_double>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)&this->fGlobal) {
    isub = 0;
    do {
      local_718.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
      local_718.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
      local_718.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_718.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_718.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018383a0;
      local_718.fSize = 100;
      local_718.fElem = local_688;
      local_718.fGiven = local_688;
      TPZVec<int>::TPZVec(&local_718.fPivot.super_TPZVec<int>,0);
      local_718.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_718.fPivot.super_TPZVec<int>.fStore = local_718.fPivot.fExtAlloc;
      local_718.fPivot.super_TPZVec<int>.fNElements = 0;
      local_718.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_718.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
      local_718.fWork.fNAlloc = 0;
      local_718.fWork.fStore = (longdouble *)0x0;
      local_718.fWork.fNElements = 0;
      local_718.fElem = (longdouble *)0x0;
      local_718.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_018380b0;
      local_df8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_df8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_df8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
      local_df8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
      local_df8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018383a0;
      local_df8.fSize = 100;
      local_df8.fElem = alStack_d68;
      local_df8.fGiven = alStack_d68;
      TPZVec<int>::TPZVec(&local_df8.fPivot.super_TPZVec<int>,0);
      local_df8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_df8.fPivot.super_TPZVec<int>.fStore = local_df8.fPivot.fExtAlloc;
      local_df8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_df8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_df8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
      local_df8.fWork.fNAlloc = 0;
      local_df8.fWork.fStore = (longdouble *)0x0;
      local_df8.fWork.fNElements = 0;
      local_df8.fElem = (longdouble *)0x0;
      local_df8.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_018380b0;
      TPZDohrAssembly<long_double>::Extract(((this->fAssemble).fRef)->fPointer,isub,x,&local_718);
      TPZDohrSubstruct<long_double>::Contribute_v2_local
                ((TPZDohrSubstruct<long_double> *)(p_Var1[1]._M_next)->_M_next,&local_718,&local_df8
                );
      TPZDohrAssembly<long_double>::Assemble(((this->fAssemble).fRef)->fPointer,isub,&local_df8,v2);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_df8,&PTR_PTR_01838368);
      TPZFMatrix<long_double>::~TPZFMatrix(&local_718,&PTR_PTR_01838368);
      isub = isub + 1;
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)&this->fGlobal);
  }
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV2(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v2) const
{
	
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// contribute v2 deve ser uma tarefa inicializada mais cedo
		TPZFNMatrix<100,TVar> Residual_local,v2_local;
		fAssemble->Extract(isub,x,Residual_local);
		(*it)->Contribute_v2_local(Residual_local,v2_local);
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Substructure " << isub << std::endl;
			Residual_local.Print("Residual local",sout);
            v2_local.Print("v2_local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		//		v2_local += v1_local;
		fAssemble->Assemble(isub,v2_local,v2);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v2.Print("v2 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}